

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_functions.hh
# Opt level: O0

void write_bits(uchar *ch,size_t *bit_offset,unsigned_long_long val,size_t bits,Pipeline *pipeline)

{
  out_of_range *this;
  unsigned_long *puVar1;
  long lVar2;
  size_t bits_left_in_ch;
  unsigned_long uStack_50;
  uchar newval;
  unsigned_long local_48;
  size_t bits_to_write;
  Pipeline *local_30;
  Pipeline *pipeline_local;
  size_t bits_local;
  unsigned_long_long val_local;
  size_t *bit_offset_local;
  uchar *ch_local;
  
  local_30 = pipeline;
  pipeline_local = (Pipeline *)bits;
  bits_local = val;
  val_local = (unsigned_long_long)bit_offset;
  bit_offset_local = (size_t *)ch;
  if (bits < 0x21) {
    for (; pipeline_local != (Pipeline *)0x0;
        pipeline_local = (Pipeline *)((long)pipeline_local - local_48)) {
      uStack_50 = *(long *)val_local + 1;
      puVar1 = std::min<unsigned_long>((unsigned_long *)&pipeline_local,&stack0xffffffffffffffb0);
      local_48 = *puVar1;
      lVar2 = (*(long *)val_local + 1) - local_48;
      *(byte *)bit_offset_local =
           (byte)*bit_offset_local |
           ((byte)(bits_local >> ((char)pipeline_local - (byte)local_48 & 0x3f)) &
           (char)(1 << ((byte)local_48 & 0x1f)) - 1U) << ((byte)lVar2 & 0x1f);
      if (lVar2 == 0) {
        (*local_30->_vptr_Pipeline[2])(local_30,bit_offset_local,1);
        *(undefined8 *)val_local = 7;
        *(undefined1 *)bit_offset_local = 0;
      }
      else {
        *(unsigned_long *)val_local = *(long *)val_local - local_48;
      }
    }
    return;
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"write_bits: too many bits requested");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

static void
write_bits(
    unsigned char& ch, size_t& bit_offset, unsigned long long val, size_t bits, Pipeline* pipeline)
{
    if (bits > 32) {
        throw std::out_of_range("write_bits: too many bits requested");
    }

    // bit_offset + 1 is the number of bits left in ch
# ifdef BITS_TESTING
    if (bits == 0) {
        QTC::TC("libtests", "bits write zero bits");
    }
# endif
    while (bits > 0) {
        size_t bits_to_write = std::min(bits, bit_offset + 1);
        unsigned char newval = static_cast<unsigned char>(
            (val >> (bits - bits_to_write)) & ((1U << bits_to_write) - 1));
        size_t bits_left_in_ch = bit_offset + 1 - bits_to_write;
        newval = static_cast<unsigned char>(newval << bits_left_in_ch);
        ch |= newval;
        if (bits_left_in_ch == 0) {
# ifdef BITS_TESTING
            QTC::TC("libtests", "bits write pipeline");
# endif
            pipeline->write(&ch, 1);
            bit_offset = 7;
            ch = 0;
        } else {
# ifdef BITS_TESTING
            QTC::TC("libtests", "bits write leftover");
# endif
            bit_offset -= bits_to_write;
        }
        bits -= bits_to_write;
# ifdef BITS_TESTING
        QTC::TC("libtests", "bits write iterations", ((bits > 8) ? 0 : (bits > 0) ? 1 : 2));
# endif
    }
}